

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

uintptr_t virt_to_phys(void *virt)

{
  int iVar1;
  ulong uVar2;
  __off_t _Var3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  undefined8 uStackY_240;
  uintptr_t phy;
  char buf [512];
  
  uVar2 = sysconf(0x1e);
  iVar1 = open("/proc/self/pagemap",0);
  if (iVar1 == -1) {
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    __xpg_strerror_r(iVar1,buf,0x200);
    pcVar6 = "getting pagemap";
    uStackY_240 = 0x19;
  }
  else {
    _Var3 = lseek(iVar1,((ulong)virt / uVar2) * 8,0);
    if (_Var3 == -1) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      __xpg_strerror_r(iVar1,buf,0x200);
      pcVar6 = "getting pagemap";
      uStackY_240 = 0x1b;
    }
    else {
      phy = 0;
      sVar4 = read(iVar1,&phy,8);
      if (sVar4 != -1) {
        close(iVar1);
        if (phy != 0) {
          return (ulong)virt % uVar2 + (phy & 0x7fffffffffffff) * uVar2;
        }
        fprintf(_stderr,
                "[ERROR] %s:%d %s(): failed to translate virtual address %p to physical address\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x20
                ,"virt_to_phys",virt);
        abort();
      }
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      __xpg_strerror_r(iVar1,buf,0x200);
      pcVar6 = "translating address";
      uStackY_240 = 0x1d;
    }
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",
          uStackY_240,"virt_to_phys",pcVar6,buf);
  exit(iVar1);
}

Assistant:

static uintptr_t virt_to_phys(void* virt) {
	long pagesize = sysconf(_SC_PAGESIZE);
	int fd = check_err(open("/proc/self/pagemap", O_RDONLY), "getting pagemap");
	// pagemap is an array of pointers for each normal-sized page
	check_err(lseek(fd, (uintptr_t) virt / pagesize * sizeof(uintptr_t), SEEK_SET), "getting pagemap");
	uintptr_t phy = 0;
	check_err(read(fd, &phy, sizeof(phy)), "translating address");
	close(fd);
	if (!phy) {
		error("failed to translate virtual address %p to physical address", virt);
	}
	// bits 0-54 are the page number
	return (phy & 0x7fffffffffffffULL) * pagesize + ((uintptr_t) virt) % pagesize;
}